

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O2

CpuInfo * asmjit::CpuInfo::getHost(void)

{
  int iVar1;
  
  if ((getHost()::host == '\0') && (iVar1 = __cxa_guard_acquire(&getHost()::host), iVar1 != 0)) {
    getHost::host.super_CpuInfo.field_9._8_8_ = 0;
    getHost::host.super_CpuInfo._brandString[8] = '\0';
    getHost::host.super_CpuInfo._brandString[9] = '\0';
    getHost::host.super_CpuInfo._brandString[10] = '\0';
    getHost::host.super_CpuInfo._brandString[0xb] = '\0';
    getHost::host.super_CpuInfo._brandString[0xc] = '\0';
    getHost::host.super_CpuInfo._brandString[0xd] = '\0';
    getHost::host.super_CpuInfo._brandString[0xe] = '\0';
    getHost::host.super_CpuInfo._brandString[0xf] = '\0';
    getHost::host.super_CpuInfo._brandString[0x10] = '\0';
    getHost::host.super_CpuInfo._brandString[0x11] = '\0';
    getHost::host.super_CpuInfo._brandString[0x12] = '\0';
    getHost::host.super_CpuInfo._brandString[0x13] = '\0';
    getHost::host.super_CpuInfo._brandString[0x14] = '\0';
    getHost::host.super_CpuInfo._brandString[0x15] = '\0';
    getHost::host.super_CpuInfo._brandString[0x16] = '\0';
    getHost::host.super_CpuInfo._brandString[0x17] = '\0';
    getHost::host.super_CpuInfo._brandString[0x18] = '\0';
    getHost::host.super_CpuInfo._brandString[0x19] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1a] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1b] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1c] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1d] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1e] = '\0';
    getHost::host.super_CpuInfo._brandString[0x1f] = '\0';
    getHost::host.super_CpuInfo._brandString[0x20] = '\0';
    getHost::host.super_CpuInfo._brandString[0x21] = '\0';
    getHost::host.super_CpuInfo._brandString[0x22] = '\0';
    getHost::host.super_CpuInfo._brandString[0x23] = '\0';
    getHost::host.super_CpuInfo._brandString[0x24] = '\0';
    getHost::host.super_CpuInfo._brandString[0x25] = '\0';
    getHost::host.super_CpuInfo._brandString[0x26] = '\0';
    getHost::host.super_CpuInfo._brandString[0x27] = '\0';
    getHost::host.super_CpuInfo._brandString[0x28] = '\0';
    getHost::host.super_CpuInfo._brandString[0x29] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2a] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2b] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2c] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2d] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2e] = '\0';
    getHost::host.super_CpuInfo._brandString[0x2f] = '\0';
    getHost::host.super_CpuInfo._brandString[0x30] = '\0';
    getHost::host.super_CpuInfo._brandString[0x31] = '\0';
    getHost::host.super_CpuInfo._brandString[0x32] = '\0';
    getHost::host.super_CpuInfo._brandString[0x33] = '\0';
    getHost::host.super_CpuInfo._brandString[0x34] = '\0';
    getHost::host.super_CpuInfo._brandString[0x35] = '\0';
    getHost::host.super_CpuInfo._brandString[0x36] = '\0';
    getHost::host.super_CpuInfo._brandString[0x37] = '\0';
    getHost::host.super_CpuInfo._brandString[0x38] = '\0';
    getHost::host.super_CpuInfo._brandString[0x39] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3a] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3b] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3c] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3d] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3e] = '\0';
    getHost::host.super_CpuInfo._brandString[0x3f] = '\0';
    getHost::host.super_CpuInfo.field_9._0_8_ = 0;
    getHost::host.super_CpuInfo._archInfo.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
    getHost::host.super_CpuInfo._vendorId = 0;
    getHost::host.super_CpuInfo._family = 0;
    getHost::host.super_CpuInfo._model = 0;
    getHost::host.super_CpuInfo._stepping = 0;
    getHost::host.super_CpuInfo._hwThreadsCount = 0;
    getHost::host.super_CpuInfo._features._bits[0] = 0;
    getHost::host.super_CpuInfo._features._bits[1] = 0;
    getHost::host.super_CpuInfo._vendorString[0] = '\0';
    getHost::host.super_CpuInfo._vendorString[1] = '\0';
    getHost::host.super_CpuInfo._vendorString[2] = '\0';
    getHost::host.super_CpuInfo._vendorString[3] = '\0';
    getHost::host.super_CpuInfo._vendorString[4] = '\0';
    getHost::host.super_CpuInfo._vendorString[5] = '\0';
    getHost::host.super_CpuInfo._vendorString[6] = '\0';
    getHost::host.super_CpuInfo._vendorString[7] = '\0';
    getHost::host.super_CpuInfo._vendorString[8] = '\0';
    getHost::host.super_CpuInfo._vendorString[9] = '\0';
    getHost::host.super_CpuInfo._vendorString[10] = '\0';
    getHost::host.super_CpuInfo._vendorString[0xb] = '\0';
    getHost::host.super_CpuInfo._vendorString[0xc] = '\0';
    getHost::host.super_CpuInfo._vendorString[0xd] = '\0';
    getHost::host.super_CpuInfo._vendorString[0xe] = '\0';
    getHost::host.super_CpuInfo._vendorString[0xf] = '\0';
    getHost::host.super_CpuInfo._brandString[0] = '\0';
    getHost::host.super_CpuInfo._brandString[1] = '\0';
    getHost::host.super_CpuInfo._brandString[2] = '\0';
    getHost::host.super_CpuInfo._brandString[3] = '\0';
    getHost::host.super_CpuInfo._brandString[4] = '\0';
    getHost::host.super_CpuInfo._brandString[5] = '\0';
    getHost::host.super_CpuInfo._brandString[6] = '\0';
    getHost::host.super_CpuInfo._brandString[7] = '\0';
    detect(&getHost::host.super_CpuInfo);
    __cxa_guard_release(&getHost()::host);
  }
  return &getHost::host.super_CpuInfo;
}

Assistant:

const CpuInfo& CpuInfo::getHost() noexcept {
  static HostCpuInfo host;
  return host;
}